

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O0

StateVector __thiscall
stateObservation::ZeroDelayObserver::getEstimatedState(ZeroDelayObserver *this,TimeIndex k)

{
  bool bVar1;
  TimeIndex TVar2;
  Matrix<double,__1,_1,_0,__1,_1> *other;
  TimeIndex in_RDX;
  Index extraout_RDX;
  StateVector SVar3;
  Matrix<double,__1,_1,_0,__1,_1> local_40;
  long local_30;
  TimeIndex i;
  TimeIndex k0;
  TimeIndex k_local;
  ZeroDelayObserver *this_local;
  
  k0 = in_RDX;
  k_local = k;
  this_local = this;
  bVar1 = stateIsSet((ZeroDelayObserver *)k);
  if (!bVar1) {
    __assert_fail("stateIsSet() && \"The state vector has not been set\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                  ,0x93,
                  "virtual ObserverBase::StateVector stateObservation::ZeroDelayObserver::getEstimatedState(TimeIndex)"
                 );
  }
  local_30 = (**(code **)(*(long *)k + 0x110))();
  i = local_30;
  if (local_30 <= k0) {
    for (; local_30 < k0; local_30 = local_30 + 1) {
      (**(code **)(*(long *)k + 0x138))(&local_40);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_40);
      TVar2 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::getFirstIndex((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)(k + 0x40));
      if (TVar2 < k0) {
        IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::popFront((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)(k + 0x40));
      }
      if ((0 < *(long *)(k + 0x18)) &&
         (TVar2 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                  ::getFirstIndex((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   *)(k + 0x98)), TVar2 < k0)) {
        IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::popFront((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)(k + 0x98));
      }
    }
    other = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::operator()
                      ((IndexedMatrixT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_false> *)(k + 0x20));
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)this,other);
    SVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         extraout_RDX;
    SVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this;
    return (StateVector)
           SVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
  }
  __assert_fail("k0 <= k && \"ERROR: The observer cannot estimate previous states\"",
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                ,0x97,
                "virtual ObserverBase::StateVector stateObservation::ZeroDelayObserver::getEstimatedState(TimeIndex)"
               );
}

Assistant:

ObserverBase::StateVector ZeroDelayObserver::getEstimatedState(TimeIndex k)
{
  BOOST_ASSERT(stateIsSet() && "The state vector has not been set");

  TimeIndex k0 = getCurrentTime();

  BOOST_ASSERT(k0 <= k && "ERROR: The observer cannot estimate previous states");

  for(TimeIndex i = k0; i < k; ++i)
  {
    oneStepEstimation_();
    if(y_.getFirstIndex() < k) y_.popFront();

    if(p_ > 0)
      if(u_.getFirstIndex() < k) u_.popFront();
  }

  return x_();
}